

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

string * __thiscall helics::ActionMessage::to_string_abi_cxx11_(ActionMessage *this)

{
  bool bVar1;
  int iVar2;
  ActionMessage *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t in_stack_00000018;
  byte *in_stack_00000020;
  ActionMessage *in_stack_00000028;
  int size;
  string *data;
  ActionMessage *in_stack_000003b8;
  size_type in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ActionMessage *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string(in_RDI);
  bVar1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                    (in_RSI,use_json_serialization_flag);
  if (bVar1) {
    to_json_string_abi_cxx11_(in_stack_000003b8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  else {
    iVar2 = serializedByteCount(in_stack_ffffffffffffffb8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5d20f7);
    toByteArray(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  }
  return in_RDI;
}

Assistant:

std::string ActionMessage::to_string() const
{
    std::string data;
    if (checkActionFlag(*this, use_json_serialization_flag)) {
        data = to_json_string();
    } else {
        auto size = serializedByteCount();
        data.resize(size);
        toByteArray(reinterpret_cast<std::byte*>(data.data()), size);
    }
    return data;
}